

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ZSTD_compressionParameters cParams1;
  ZSTD_window_t window;
  ZSTD_window_t window_00;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  int iVar21;
  U32 UVar22;
  uint uVar23;
  BYTE *iend_00;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 uVar24;
  undefined8 in_stack_ffffffffffffff44;
  U32 local_a4;
  byte local_a0;
  byte local_9c;
  uint local_98;
  U32 local_94;
  bool local_89;
  size_t tagTableSize;
  U32 maxDictSize_1;
  U32 shortCacheMaxDictSize;
  int CDictTaggedIndices;
  U32 maxDictSize;
  int loadLdmDict;
  BYTE *iend;
  BYTE *ip;
  size_t srcSize_local;
  void *src_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_cwksp *ws_local;
  ldmState_t *ls_local;
  ZSTD_matchState_t *ms_local;
  
  iend_00 = (BYTE *)((long)src + srcSize);
  local_89 = (params->ldmParams).enableLdm == ZSTD_ps_enable && ls != (ldmState_t *)0x0;
  uVar5 = (params->cParams).hashLog;
  uVar6 = (params->cParams).searchLog;
  uVar7 = (params->cParams).minMatch;
  uVar8 = (params->cParams).targetLength;
  uVar9 = (params->cParams).strategy;
  cParams1.minMatch = uVar9;
  cParams1.searchLog = uVar8;
  cParams1.hashLog = uVar7;
  cParams1.chainLog = uVar6;
  cParams1.windowLog = uVar5;
  uVar1 = (ms->cParams).windowLog;
  uVar24._0_4_ = (ms->cParams).hashLog;
  uVar24._4_4_ = (ms->cParams).searchLog;
  uVar10 = (ms->cParams).hashLog;
  uVar11 = (ms->cParams).searchLog;
  uVar12 = (ms->cParams).minMatch;
  uVar13 = (ms->cParams).targetLength;
  uVar14 = (ms->cParams).strategy;
  cParams2.minMatch = uVar14;
  cParams2.searchLog = uVar13;
  cParams2.hashLog = uVar12;
  cParams2.chainLog = uVar11;
  cParams2.windowLog = uVar10;
  cParams1.targetLength = in_stack_ffffffffffffff24;
  cParams1.strategy = uVar1;
  cParams2._20_8_ = in_stack_ffffffffffffff44;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  shortCacheMaxDictSize = 0xdffffffe;
  iVar21 = ZSTD_CDictIndicesAreTagged(&params->cParams);
  if (((iVar21 != 0) && (tfp == ZSTD_tfp_forCDict)) && (shortCacheMaxDictSize = 0xfffffe, local_89))
  {
    __assert_fail("!loadLdmDict",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1269,
                  "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                 );
  }
  ip = (BYTE *)srcSize;
  srcSize_local = (size_t)src;
  if (shortCacheMaxDictSize < srcSize) {
    srcSize_local = (long)iend_00 - (ulong)shortCacheMaxDictSize;
    ip = (BYTE *)(ulong)shortCacheMaxDictSize;
  }
  if ((BYTE *)0x1fffffff < ip) {
    uVar2 = *(undefined8 *)&(ms->window).nbOverflowCorrections;
    uVar3 = (ms->window).lowLimit;
    uVar15 = (ms->window).base;
    uVar16 = (ms->window).dictBase;
    uVar17 = (ms->window).dictLimit;
    window.dictBase._0_4_ = uVar17;
    window.base = (BYTE *)uVar16;
    window.nextSrc = (BYTE *)uVar15;
    window.dictBase._4_4_ = uVar3;
    window.dictLimit = (int)uVar2;
    window.lowLimit = (int)((ulong)uVar2 >> 0x20);
    window._32_8_ = uVar24;
    UVar22 = ZSTD_window_isEmpty(window);
    if (UVar22 == 0) {
      __assert_fail("ZSTD_window_isEmpty(ms->window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1276,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    if ((local_89) &&
       (uVar2 = *(undefined8 *)&(ls->window).nbOverflowCorrections, uVar4 = (ls->window).lowLimit,
       uVar18 = (ls->window).base, uVar19 = (ls->window).dictBase, uVar20 = (ls->window).dictLimit,
       window_00.dictBase._0_4_ = uVar20, window_00.base = (BYTE *)uVar19,
       window_00.nextSrc = (BYTE *)uVar18, window_00.dictBase._4_4_ = uVar4,
       window_00.dictLimit = (int)uVar2, window_00.lowLimit = (int)((ulong)uVar2 >> 0x20),
       window_00._32_8_ = uVar24, UVar22 = ZSTD_window_isEmpty(window_00), UVar22 == 0)) {
      __assert_fail("ZSTD_window_isEmpty(ls->window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1277,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
  }
  ZSTD_window_update(&ms->window,(void *)srcSize_local,(size_t)ip,0);
  iVar21 = (int)iend_00;
  if (local_89) {
    ZSTD_window_update(&ls->window,(void *)srcSize_local,(size_t)ip,0);
    if (params->forceWindow == 0) {
      local_94 = iVar21 - (int)(ls->window).base;
    }
    else {
      local_94 = 0;
    }
    ls->loadedDictEnd = local_94;
    ZSTD_ldm_fillHashTable(ls,(BYTE *)srcSize_local,iend_00,&params->ldmParams);
  }
  iend = (BYTE *)srcSize_local;
  if ((params->cParams).strategy < ZSTD_btultra) {
    if ((params->cParams).chainLog < (params->cParams).hashLog) {
      local_98 = (params->cParams).hashLog;
    }
    else {
      local_98 = (params->cParams).chainLog;
    }
    if (local_98 < 0x1c) {
      if ((params->cParams).chainLog < (params->cParams).hashLog) {
        local_9c = (byte)(params->cParams).hashLog;
      }
      else {
        local_9c = (byte)(params->cParams).chainLog;
      }
      local_a0 = local_9c;
    }
    else {
      local_a0 = 0x1c;
    }
    uVar23 = 8 << (local_a0 & 0x1f);
    if ((BYTE *)(ulong)uVar23 < ip) {
      iend = iend_00 + -(ulong)uVar23;
      ip = (BYTE *)(ulong)uVar23;
    }
  }
  ms->nextToUpdate = (int)iend - (int)(ms->window).base;
  if (params->forceWindow == 0) {
    local_a4 = iVar21 - (int)(ms->window).base;
  }
  else {
    local_a4 = 0;
  }
  ms->loadedDictEnd = local_a4;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if ((BYTE *)0x8 < ip) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,iend,iend_00);
    switch((params->cParams).strategy) {
    case ZSTD_fast:
      ZSTD_fillHashTable(ms,iend_00,dtlm,tfp);
      break;
    case ZSTD_dfast:
      ZSTD_fillDoubleHashTable(ms,iend_00,dtlm,tfp);
      break;
    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
      if (ip < (BYTE *)0x8) {
        __assert_fail("srcSize >= HASH_READ_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x12a1,
                      "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                     );
      }
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_ps_auto) {
          __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x12a6,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        if (params->useRowMatchFinder == ZSTD_ps_enable) {
          memset(ms->tagTable,0,1L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend_00 + -8);
        }
        else {
          ZSTD_insertAndFindFirstIndex(ms,iend_00 + -8);
        }
      }
      else {
        if (ms->chainTable == (U32 *)0x0) {
          __assert_fail("ms->chainTable != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x12a3,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend_00 + -8);
      }
      break;
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
      if (ip < (BYTE *)0x8) {
        __assert_fail("srcSize >= HASH_READ_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x12b7,
                      "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                     );
      }
      ZSTD_updateTree(ms,iend_00 + -8,iend_00);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x12bc,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    ms->nextToUpdate = iVar21 - (int)(ms->window).base;
  }
  return 0;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            /* src = ip; deadcode.DeadStores */
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}